

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_neon_narrow_op(TCGContext_conflict1 *tcg_ctx,int op,int u,int size,TCGv_i32 dest,
                       TCGv_i64 src)

{
  int nargs;
  code *func;
  TCGTemp *args [1];
  
  if (op == 0) {
    if (u == 0) {
      if (size == 2) {
        args[0] = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        func = helper_neon_narrow_sat_s32_aarch64;
      }
      else if (size == 1) {
        args[0] = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        func = helper_neon_narrow_sat_s16_aarch64;
      }
      else {
        if (size != 0) goto LAB_005ef874;
        args[0] = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
        func = helper_neon_narrow_sat_s8_aarch64;
      }
    }
    else if (size == 2) {
      args[0] = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      func = helper_neon_narrow_sat_u32_aarch64;
    }
    else if (size == 1) {
      args[0] = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      func = helper_neon_narrow_sat_u16_aarch64;
    }
    else {
      if (size != 0) goto LAB_005ef874;
      args[0] = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      func = helper_neon_narrow_sat_u8_aarch64;
    }
  }
  else {
    if (u == 0) {
      if (size == 2) {
        tcg_gen_extrl_i64_i32_aarch64(tcg_ctx,dest,src);
        return;
      }
      if (size == 1) {
        func = helper_neon_narrow_u16_aarch64;
      }
      else {
        if (size != 0) {
LAB_005ef874:
          abort();
        }
        func = helper_neon_narrow_u8_aarch64;
      }
      args[0] = (TCGTemp *)(src + (long)tcg_ctx);
      nargs = 1;
      goto LAB_005ef863;
    }
    if (size == 2) {
      args[0] = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      func = helper_neon_unarrow_sat32_aarch64;
    }
    else if (size == 1) {
      args[0] = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      func = helper_neon_unarrow_sat16_aarch64;
    }
    else {
      if (size != 0) goto LAB_005ef874;
      args[0] = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      func = helper_neon_unarrow_sat8_aarch64;
    }
  }
  nargs = 2;
LAB_005ef863:
  tcg_gen_callN_aarch64(tcg_ctx,func,(TCGTemp *)(dest + (long)tcg_ctx),nargs,args);
  return;
}

Assistant:

static void gen_neon_narrow_op(TCGContext *tcg_ctx, int op, int u, int size,
                               TCGv_i32 dest, TCGv_i64 src)
{
    if (op) {
        if (u) {
            gen_neon_unarrow_sats(tcg_ctx, size, dest, src);
        } else {
            gen_neon_narrow(tcg_ctx, size, dest, src);
        }
    } else {
        if (u) {
            gen_neon_narrow_satu(tcg_ctx, size, dest, src);
        } else {
            gen_neon_narrow_sats(tcg_ctx, size, dest, src);
        }
    }
}